

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::logProgram
          (TextureCubeMapArraySamplingTest *this,programDefinition *info)

{
  ostringstream *this_00;
  shaderDefinition *psVar1;
  shaderDefinition *psVar2;
  shaderDefinition *psVar3;
  shaderDefinition *psVar4;
  shaderDefinition *psVar5;
  shaderDefinition *psVar6;
  MessageBuilder message;
  undefined1 local_1b0 [384];
  
  if (info->m_program_object_id != 0) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Program id: ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    psVar1 = info->compute_shader;
    psVar2 = info->geometry_shader;
    psVar3 = info->fragment_shader;
    psVar4 = info->tesselation_control_shader;
    psVar5 = info->tesselation_evaluation_shader;
    psVar6 = info->vertex_shader;
    if (psVar1 != (shaderDefinition *)0x0) {
      std::operator<<((ostream *)this_00,"\nCompute shader:\n");
      std::operator<<((ostream *)this_00,(string *)&psVar1->m_source);
    }
    if (psVar6 != (shaderDefinition *)0x0) {
      std::operator<<((ostream *)this_00,"\nVertex shader:\n");
      std::operator<<((ostream *)this_00,(string *)&psVar6->m_source);
    }
    if (psVar2 != (shaderDefinition *)0x0) {
      std::operator<<((ostream *)this_00,"\nGeometry shader:\n");
      std::operator<<((ostream *)this_00,(string *)&psVar2->m_source);
    }
    if (psVar4 != (shaderDefinition *)0x0) {
      std::operator<<((ostream *)this_00,"\nTCS shader:\n");
      std::operator<<((ostream *)this_00,(string *)&psVar4->m_source);
    }
    if (psVar5 != (shaderDefinition *)0x0) {
      std::operator<<((ostream *)this_00,"\nTES shader:\n");
      std::operator<<((ostream *)this_00,(string *)&psVar5->m_source);
    }
    if (psVar3 != (shaderDefinition *)0x0) {
      std::operator<<((ostream *)this_00,"\nFragment shader:\n");
      std::operator<<((ostream *)this_00,(string *)&psVar3->m_source);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return;
}

Assistant:

glw::GLuint TextureCubeMapArraySamplingTest::programDefinition::getProgramId() const
{
	return m_program_object_id;
}